

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readChunkHeader(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *__return_storage_ptr___00;
  char cVar1;
  PromiseArenaMember *node;
  long lVar2;
  long lVar3;
  SourceLocation location;
  int iVar4;
  uint uVar5;
  coroutine_handle<void> coroutine;
  FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *pFVar6;
  long in_RSI;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  Fault f;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  Fault local_78;
  FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *local_70;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  local_68;
  ArrayPtr<char> *local_40;
  ExceptionOrValue *local_38;
  
  coroutine._M_fr_ptr = operator_new(0x580);
  *(code **)coroutine._M_fr_ptr = readChunkHeader;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readChunkHeader;
  this_00 = (Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)coroutine._M_fr_ptr + 0x10);
  local_68.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)0x50fbd6;
  local_68.right = (None *)0x511100;
  local_68.op.content.ptr = (char *)0x400000060a;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642348;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00642390;
  local_38 = (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98);
  location.function = "readChunkHeader";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x60a;
  location.columnNumber = 0x40;
  kj::_::CoroutineBase::CoroutineBase((CoroutineBase *)this_00,coroutine,local_38,location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642348;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00642390;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  local_68.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0xd8);
  bVar9 = *(long *)(in_RSI + 0xe0) == 0;
  local_68.right = (None *)&kj::none;
  local_68.op.content.ptr = " != ";
  local_68.op.content.size_ = 5;
  local_68.result = !bVar9;
  if (bVar9) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x60b,FAILED,"onMessageDone != kj::none","_kjCondition,",&local_68);
    kj::_::Debug::Fault::fatal(&local_78);
  }
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x570);
  readHeader(this_01,(HeaderType)in_RSI,1,*(size_t *)(in_RSI + 0x30));
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)coroutine._M_fr_ptr + 0x278);
  co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x578) = 0;
  bVar9 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (bVar9) {
    return (PromiseBase)(PromiseBase)this;
  }
  __return_storage_ptr___00 =
       (OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
       ((long)coroutine._M_fr_ptr + 0x470);
  kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
  await_resume(__return_storage_ptr___00,__return_storage_ptr__);
  if (*(char *)((long)coroutine._M_fr_ptr + 0x428) == '\x01') {
    if (*(int *)((long)coroutine._M_fr_ptr + 0x430) == 1) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
    }
    if (*(int *)((long)coroutine._M_fr_ptr + 0x430) == 2) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
    }
  }
  if (*(char *)((long)coroutine._M_fr_ptr + 0x290) == '\x01') {
    Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x298));
  }
  kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
  node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
  if (node != (PromiseArenaMember *)0x0) {
    (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  if (__return_storage_ptr___00->tag == 1) {
    local_68.left =
         *(Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> **)
          ((long)coroutine._M_fr_ptr + 0x480);
    local_68.right = (None *)((ulong)local_68.right & 0xffffffff00000000);
    local_68.op.content.ptr = " > ";
    local_68.op.content.size_ = 4;
    local_68.result =
         local_68.left != (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)0x0;
    if (!local_68.result) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x615,FAILED,"text.size() > 0","_kjCondition,",
                 (DebugComparison<unsigned_long,_int> *)&local_68);
      kj::_::Debug::Fault::~Fault(&local_78);
    }
    lVar2 = *(long *)((long)coroutine._M_fr_ptr + 0x480);
    iVar4 = 0x11;
    if (lVar2 == 0) {
      uVar7 = 0;
    }
    else {
      local_70 = (FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
                 ((long)coroutine._M_fr_ptr + 0x4f0);
      local_40 = (ArrayPtr<char> *)((long)coroutine._M_fr_ptr + 0x478);
      lVar3 = *(long *)((long)coroutine._M_fr_ptr + 0x478);
      lVar8 = 0;
      uVar7 = 0;
      do {
        cVar1 = *(char *)(lVar3 + lVar8);
        iVar4 = (int)cVar1;
        if ((byte)(cVar1 - 0x30U) < 10) {
          uVar7 = uVar7 << 4 | (ulong)(iVar4 - 0x30);
LAB_003a9f64:
          iVar4 = 0;
          bVar9 = true;
        }
        else {
          if ((byte)(cVar1 + 0x9fU) < 6) {
            uVar5 = iVar4 - 0x57;
LAB_003a9f61:
            uVar7 = uVar7 * 0x10 + (ulong)uVar5;
            goto LAB_003a9f64;
          }
          if ((byte)(cVar1 + 0xbfU) < 6) {
            uVar5 = iVar4 - 0x37;
            goto LAB_003a9f61;
          }
          local_68.left =
               *(Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> **)
                ((long)coroutine._M_fr_ptr + 0x478);
          local_68.right = *(None **)((long)coroutine._M_fr_ptr + 0x480);
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,char_const(&)[24],kj::ArrayPtr<char>&,kj::ArrayPtr<unsigned_char>>
                    (&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x620,FAILED,(char *)0x0,"\"invalid HTTP chunk size\", text, text.asBytes()",
                     (char (*) [24])"invalid HTTP chunk size",local_40,
                     (ArrayPtr<unsigned_char> *)&local_68);
          kj::_::Debug::Fault::~Fault(&local_78);
          pFVar6 = local_70;
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4f0) = 1;
          *(ulong *)((long)coroutine._M_fr_ptr + 0x4f8) = uVar7;
          kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::fulfill
                    (this_00,local_70);
          if (pFVar6->tag == 1) {
            pFVar6->tag = 0;
          }
          iVar4 = 3;
          if (pFVar6->tag == 2) {
            pFVar6->tag = 0;
          }
          bVar9 = false;
        }
        if (!bVar9) goto LAB_003aa044;
        lVar8 = lVar8 + 1;
      } while (lVar2 != lVar8);
      iVar4 = 0x11;
    }
LAB_003aa044:
    if (iVar4 != 0x11) goto LAB_003aa08b;
    pFVar6 = (FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
             ((long)coroutine._M_fr_ptr + 0x530);
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x530) = 1;
    *(ulong *)((long)coroutine._M_fr_ptr + 0x538) = uVar7;
    kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::fulfill
              (this_00,pFVar6);
  }
  else {
    iVar4 = 0;
    if (__return_storage_ptr___00->tag != 2) goto LAB_003aa08b;
    pFVar6 = (FixVoid<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
             ((long)coroutine._M_fr_ptr + 0x4b0);
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4b0) = 2;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4b8) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x478);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c0) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x480);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c8) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x488);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d0) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x490);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d8) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x498);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e0) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4a0);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e8) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4a8);
    kj::_::Coroutine<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::fulfill
              (this_00,pFVar6);
  }
  if (pFVar6->tag == 1) {
    pFVar6->tag = 0;
  }
  iVar4 = 3;
  if (pFVar6->tag == 2) {
    pFVar6->tag = 0;
  }
LAB_003aa08b:
  if ((iVar4 != 7) && (iVar4 != 0)) {
    if (__return_storage_ptr___00->tag == 1) {
      __return_storage_ptr___00->tag = 0;
    }
    if (__return_storage_ptr___00->tag == 2) {
      __return_storage_ptr___00->tag = 0;
    }
    if (iVar4 == 3) {
      *(undefined8 *)coroutine._M_fr_ptr = 0;
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x578) = 1;
    }
    else {
      if (*(char *)((long)coroutine._M_fr_ptr + 0x230) == '\x01') {
        if (*(int *)((long)coroutine._M_fr_ptr + 0x238) == 1) {
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
        }
        if (*(int *)((long)coroutine._M_fr_ptr + 0x238) == 2) {
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
        }
      }
      if ((local_38->exception).ptr.isSet == true) {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
      }
      kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
      operator_delete(coroutine._M_fr_ptr,0x580);
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::unreachable();
}

Assistant:

kj::Promise<kj::OneOf<uint64_t, HttpHeaders::ProtocolError>> readChunkHeader() {
    KJ_REQUIRE(onMessageDone != kj::none);

    // We use the portion of the header after the end of message headers.
    auto textOrError = co_await readHeader(HeaderType::CHUNK, messageHeaderEnd, messageHeaderEnd);

    KJ_SWITCH_ONEOF(textOrError) {
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        co_return protocolError;
      }
      KJ_CASE_ONEOF(text, kj::ArrayPtr<char>) {
        KJ_REQUIRE(text.size() > 0) { break; }

        uint64_t value = 0;
        for (char c: text) {
          if ('0' <= c && c <= '9') {
            value = value * 16 + (c - '0');
          } else if ('a' <= c && c <= 'f') {
            value = value * 16 + (c - 'a' + 10);
          } else if ('A' <= c && c <= 'F') {
            value = value * 16 + (c - 'A' + 10);
          } else {
            KJ_FAIL_REQUIRE("invalid HTTP chunk size", text, text.asBytes()) { break; }
            co_return value;
          }
        }

        co_return value;
      }
    }

    KJ_UNREACHABLE;
  }